

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O2

vector<cv::DMatch,_std::allocator<cv::DMatch>_> *
filter_match(vector<cv::DMatch,_std::allocator<cv::DMatch>_> *__return_storage_ptr__,
            vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_model,
            vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test,
            vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
            *matches,double lowe_ratio)

{
  pointer pvVar1;
  value_type *__x;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> *vals;
  pointer pvVar2;
  
  (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = (matches->
           super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar2 = (matches->
                super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar2 != pvVar1; pvVar2 = pvVar2 + 1) {
    __x = (pvVar2->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
          super__Vector_impl_data._M_start;
    if ((double)*(float *)(__x + 0xc) < (double)*(float *)(__x + 0x1c) * lowe_ratio) {
      std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::DMatch> filter_match(const std::vector<cv::KeyPoint>& keypoint_model,
    const std::vector<cv::KeyPoint>& keypoint_test, const std::vector<std::vector<cv::DMatch>>& matches,
    double lowe_ratio)
{
    std::vector<cv::DMatch> result;
    for(const auto& vals : matches)
    {
        if(vals[0].distance < lowe_ratio * vals[1].distance)
        {
            result.push_back(vals[0]);
        }
    }
    return result;
}